

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::AST_Node::to_string(string *__return_storage_ptr__,AST_Node *this,string *t_prepend)

{
  char *__s;
  AST_Node *this_00;
  pointer pcVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream oss;
  string local_208;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  long local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(t_prepend->_M_dataplus)._M_p,t_prepend->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  __s = *(char **)(&DAT_003c6750 + (long)(int)this->identifier * 8);
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->text)._M_dataplus._M_p,(this->text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.column);
  local_208._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_208,1);
  (**this->_vptr_AST_Node)(&local_1e8,this);
  if (local_1e8 != local_1e0) {
    puVar4 = local_1e8;
    local_1b0 = __return_storage_ptr__;
    do {
      this_00 = (AST_Node *)*puVar4;
      pcVar1 = (t_prepend->_M_dataplus)._M_p;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar1,pcVar1 + t_prepend->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1d0,"  ");
      to_string(&local_208,this_00,&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 (char *)CONCAT71(local_208._M_dataplus._M_p._1_7_,local_208._M_dataplus._M_p._0_1_)
                 ,local_208._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_208._M_dataplus._M_p._1_7_,local_208._M_dataplus._M_p._0_1_) !=
          &local_208.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_208._M_dataplus._M_p._1_7_,local_208._M_dataplus._M_p._0_1_),
                        local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      puVar4 = puVar4 + 1;
      __return_storage_ptr__ = local_1b0;
    } while (puVar4 != local_1e0);
  }
  if (local_1e8 != (undefined8 *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
      std::ostringstream oss;

      oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") " << this->text << " : " << this->location.start.line
          << ", " << this->location.start.column << '\n';

      for (auto &elem : get_children()) {
        oss << elem.get().to_string(t_prepend + "  ");
      }
      return oss.str();
    }